

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCountedObjectImpl.hpp
# Opt level: O0

void __thiscall
Diligent::RefCountersImpl::
ObjectWrapper<Diligent::ShaderResourceBindingVkImpl,_Diligent::FixedBlockMemoryAllocator>::
DestroyObject(ObjectWrapper<Diligent::ShaderResourceBindingVkImpl,_Diligent::FixedBlockMemoryAllocator>
              *this)

{
  RefCountedObject<Diligent::IShaderResourceBindingVk> *this_00;
  void *in_RSI;
  ObjectWrapper<Diligent::ShaderResourceBindingVkImpl,_Diligent::FixedBlockMemoryAllocator>
  *this_local;
  
  if (this->m_pAllocator == (FixedBlockMemoryAllocator *)0x0) {
    this_00 = (RefCountedObject<Diligent::IShaderResourceBindingVk> *)this->m_pObject;
    if (this_00 != (RefCountedObject<Diligent::IShaderResourceBindingVk> *)0x0) {
      ShaderResourceBindingVkImpl::~ShaderResourceBindingVkImpl
                ((ShaderResourceBindingVkImpl *)this_00);
      RefCountedObject<Diligent::IShaderResourceBindingVk>::operator_delete(this_00,in_RSI);
    }
  }
  else {
    ShaderResourceBindingVkImpl::~ShaderResourceBindingVkImpl(this->m_pObject);
    FixedBlockMemoryAllocator::Free(this->m_pAllocator,this->m_pObject);
  }
  return;
}

Assistant:

virtual void DestroyObject() override final
        {
            if (m_pAllocator)
            {
                m_pObject->~ObjectType();
                m_pAllocator->Free(m_pObject);
            }
            else
            {
                delete m_pObject;
            }
        }